

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  undefined8 *puVar1;
  int iVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  double __x;
  bool bVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  DataArray<int> *pDVar8;
  bool bVar9;
  type_conflict5 tVar10;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  cpp_dec_float<50U,_int,_void> local_248;
  double local_208;
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  int local_1e0;
  bool local_1dc;
  fpclass_type local_1d8;
  int32_t iStack_1d4;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  DataArray<int> *local_1c0;
  long local_1b8;
  DataArray<int> *local_1b0;
  Item *local_1a8;
  long local_1a0;
  double local_198;
  uint auStack_190 [2];
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [4];
  double local_168;
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  int local_140;
  bool local_13c;
  fpclass_type local_138;
  int32_t local_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  double local_e8;
  uint auStack_e0 [2];
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8 [2];
  int local_c0;
  bool local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  soplex local_68 [56];
  
  local_1b8 = 0;
  local_1c8 = vecset;
  local_1c0 = scaleExp;
  local_1b0 = coScaleExp;
  while (local_1b8 < (local_1c8->set).thenum) {
    iVar2 = (local_1c8->set).thekey[local_1b8].idx;
    pIVar3 = (local_1c8->set).theitem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&local_208,0.0,(type *)0x0);
    lVar12 = 0;
    lVar11 = 0;
    local_1a8 = pIVar3 + iVar2;
    while (lVar11 < (local_1a8->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
      pNVar4 = (local_1a8->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_88 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar12 + 0x20);
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar12);
      local_a8 = *puVar1;
      uStack_a0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar12 + 0x10);
      local_98 = *puVar1;
      uStack_90 = puVar1[1];
      local_80 = *(undefined4 *)((long)&(pNVar4->val).m_backend.data + lVar12 + 0x28);
      local_7c = *(undefined1 *)((long)&(pNVar4->val).m_backend.data + lVar12 + 0x2c);
      local_78 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar12 + 0x30);
      local_1a0 = lVar11;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_68,(soplex *)&local_a8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)local_1b0->data
                                 [*(int *)((long)(&((local_1a8->data).
                                                                                                        
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar12)],(int)local_1b0->data
                );
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_248,local_68,a);
      bVar5 = local_248.neg;
      iVar2 = local_248.exp;
      local_178[1]._1_3_ = local_248.data._M_elems[9]._1_3_;
      local_178._0_5_ = local_248.data._M_elems._32_5_;
      auStack_180[1]._1_3_ = local_248.data._M_elems[7]._1_3_;
      auStack_180._0_5_ = local_248.data._M_elems._24_5_;
      local_188[0] = local_248.data._M_elems[4];
      local_188[1] = local_248.data._M_elems[5];
      local_198 = (double)local_248.data._M_elems._0_8_;
      auStack_190[0] = local_248.data._M_elems[2];
      auStack_190[1] = local_248.data._M_elems[3];
      fVar6 = local_248.fpclass;
      iVar7 = local_248.prec_elem;
      local_168 = (double)local_248.data._M_elems._0_8_;
      auStack_160[0] = local_248.data._M_elems[2];
      auStack_160[1] = local_248.data._M_elems[3];
      local_158[0] = local_248.data._M_elems[4];
      local_158[1] = local_248.data._M_elems[5];
      local_140 = local_248.exp;
      local_13c = local_248.neg;
      local_138 = local_248.fpclass;
      local_134 = local_248.prec_elem;
      local_c8[0] = local_1e8[0];
      local_c8[1] = local_1e8[1];
      local_d8[0] = local_1f8[0];
      local_d8[1] = local_1f8[1];
      auStack_d0[0] = auStack_1f0[0];
      auStack_d0[1] = auStack_1f0[1];
      local_e8 = local_208;
      auStack_e0[0] = auStack_200[0];
      auStack_e0[1] = auStack_200[1];
      local_c0 = local_1e0;
      local_bc = local_1dc;
      local_b8._4_4_ = iStack_1d4;
      local_b8._0_4_ = local_1d8;
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_128.m_backend.exp = (epsilon->m_backend).exp;
      local_128.m_backend.neg = (epsilon->m_backend).neg;
      local_128.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_128.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      auStack_150 = auStack_180;
      local_148 = (uint  [2])local_178._0_8_;
      bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e8,&local_128);
      if (bVar9) {
        local_1e8[0] = local_178[0];
        local_1e8[1] = local_178[1];
        local_1f8[0] = local_188[0];
        local_1f8[1] = local_188[1];
        auStack_1f0[0] = auStack_180[0];
        auStack_1f0[1] = auStack_180[1];
        local_208 = local_198;
        auStack_200[0] = auStack_190[0];
        auStack_200[1] = auStack_190[1];
        local_1e0 = iVar2;
        local_1dc = bVar5;
        local_1d8 = fVar6;
        iStack_1d4 = iVar7;
      }
      lVar12 = lVar12 + 0x3c;
      lVar11 = local_1a0 + 1;
    }
    local_248.data._M_elems[0] = 0;
    local_248.data._M_elems[1] = 0;
    tVar10 = boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_208,(double *)&local_248);
    if (tVar10) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_208,1.0);
    }
    local_198 = 1.0;
    local_248.fpclass = cpp_dec_float_finite;
    local_248.prec_elem = 10;
    local_248.data._M_elems._0_8_ = 0.0;
    local_248.data._M_elems[2] = 0;
    local_248.data._M_elems[3] = 0;
    local_248.data._M_elems[4] = 0;
    local_248.data._M_elems[5] = 0;
    local_248.data._M_elems._24_5_ = 0;
    local_248.data._M_elems[7]._1_3_ = 0;
    local_248.data._M_elems._32_5_ = 0;
    local_248.data._M_elems[9]._1_3_ = 0;
    local_248.exp = 0;
    local_248.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_248,&local_198,(cpp_dec_float<50U,_int,_void> *)&local_208);
    __x = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double(&local_248)
    ;
    lVar11 = local_1b8;
    pDVar8 = local_1c0;
    frexp(__x,local_1c0->data + local_1b8);
    pDVar8->data[lVar11] = pDVar8->data[lVar11] + -1;
    local_1b8 = lVar11 + 1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}